

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

type_conflict3 jsteemann::atoi<unsigned_short>(char *p,char *e,bool *valid)

{
  bool *valid_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *valid = false;
    p_local._6_2_ = 0;
  }
  else if (*p == '-') {
    *valid = false;
    p_local._6_2_ = 0;
  }
  else {
    e_local = p;
    if (*p == '+') {
      e_local = p + 1;
    }
    p_local._6_2_ = atoi_positive<unsigned_short>(e_local,e,valid);
  }
  return p_local._6_2_;
}

Assistant:

inline typename std::enable_if<std::is_unsigned<T>::value, T>::type atoi(char const* p, char const* e, bool& valid) noexcept {
  if (ATOI_UNLIKELY(p == e)) {
    valid = false;
    return T();
  }

  if (*p == '-') {
    valid = false;
    return T();
  } 
  if (ATOI_UNLIKELY(*p == '+')) {
    ++p;
  }
  
  return atoi_positive<T>(p, e, valid);
}